

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O0

void test_slow_cert_verify(void)

{
  int iVar1;
  int restrict_sending;
  size_t min_packets_to_send;
  int64_t last_retransmittable_sent_at;
  quicly_loss_t loss;
  undefined8 in_stack_ffffffffffffff38;
  uint16_t uVar2;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint8_t ack_epoch;
  quicly_loss_t *in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  size_t epoch;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  quicly_loss_t *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  quicly_loss_t *in_stack_ffffffffffffff80;
  quicly_loss_t *in_stack_ffffffffffffff88;
  uint64_t in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  long local_48;
  int64_t local_40;
  uint8_t *in_stack_ffffffffffffffd0;
  uint16_t *in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffe4;
  quicly_loss_conf_t *in_stack_ffffffffffffffe8;
  quicly_loss_t *in_stack_fffffffffffffff0;
  
  uVar2 = (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  now = 0;
  num_packets_lost = 0;
  quicly_loss_init(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                   in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  _ok((int)(ulong)(local_48 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x90);
  iVar1 = quicly_sentmap_prepare
                    ((quicly_sentmap_t *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
                     (uint8_t)(in_stack_ffffffffffffff54 >> 0x18));
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x93);
  quicly_sentmap_commit
            ((quicly_sentmap_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),uVar2
            );
  iVar1 = quicly_sentmap_prepare
                    ((quicly_sentmap_t *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60,(int64_t)in_stack_ffffffffffffff58,
                     (uint8_t)(in_stack_ffffffffffffff54 >> 0x18));
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x95);
  quicly_sentmap_commit
            ((quicly_sentmap_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),uVar2
            );
  uVar3 = 1;
  epoch = now;
  quicly_loss_update_alarm
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,(int64_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
             ,(int)((ulong)now >> 0x20),in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  now = now + 10;
  acked(in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
        epoch);
  iVar1 = quicly_loss_detect_loss
                    (in_stack_ffffffffffffff88,(int64_t)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                     (quicly_loss_on_detect_cb)in_stack_ffffffffffffff70);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x9e);
  _ok((int)(ulong)(local_48 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x9f);
  _ok((int)(ulong)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa0);
  now = local_40;
  uVar2 = 0;
  iVar1 = quicly_loss_on_alarm
                    (in_stack_ffffffffffffff58,
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                     (size_t *)CONCAT44(in_stack_ffffffffffffff44,uVar3),(int *)on_loss_detected,
                     (quicly_loss_on_detect_cb)in_stack_ffffffffffffff70);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa5);
  _ok((int)(ulong)in_stack_ffffffffffffff54,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa6);
  ack_epoch = (uint8_t)(in_stack_ffffffffffffff54 >> 0x18);
  _ok((int)(ulong)(in_stack_ffffffffffffff58 == (quicly_loss_t *)0x2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa7);
  _ok((int)(ulong)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa8);
  iVar1 = quicly_sentmap_prepare
                    ((quicly_sentmap_t *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),epoch,
                     (int64_t)in_stack_ffffffffffffff58,ack_epoch);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xab);
  quicly_sentmap_commit((quicly_sentmap_t *)CONCAT44(in_stack_ffffffffffffff44,uVar3),uVar2);
  iVar1 = quicly_sentmap_prepare
                    ((quicly_sentmap_t *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),epoch,
                     (int64_t)in_stack_ffffffffffffff58,ack_epoch);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xad);
  quicly_sentmap_commit((quicly_sentmap_t *)CONCAT44(in_stack_ffffffffffffff44,uVar3),uVar2);
  now = now + 10;
  acked(in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
        epoch);
  iVar1 = quicly_loss_detect_loss
                    (in_stack_ffffffffffffff88,(int64_t)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                     (quicly_loss_on_detect_cb)in_stack_ffffffffffffff70);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xb4);
  _ok((int)(ulong)(local_48 == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xb5);
  _ok((int)(ulong)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xb6);
  quicly_loss_dispose((quicly_loss_t *)0x12ee06);
  return;
}

Assistant:

static void test_slow_cert_verify(void)
{
    quicly_loss_t loss;
    int64_t last_retransmittable_sent_at;
    size_t min_packets_to_send;
    int restrict_sending;

    now = 0;
    num_packets_lost = 0;

    quicly_loss_init(&loss, &quicly_spec_context.loss, 20, &quicly_spec_context.transport_params.max_ack_delay,
                     &quicly_spec_context.transport_params.ack_delay_exponent);
    ok(loss.loss_time == INT64_MAX);

    /* sent Handshake+1RTT packet */
    ok(quicly_sentmap_prepare(&loss.sentmap, 1, now, QUICLY_EPOCH_HANDSHAKE) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 2, now, QUICLY_EPOCH_1RTT) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    last_retransmittable_sent_at = now;
    quicly_loss_update_alarm(&loss, now, last_retransmittable_sent_at, 1, 0, 1, 0, 1);

    now += 10;

    /* receive ack for the Handshake packet, but 1RTT packet remains unacknowledged */
    acked(&loss, 1, QUICLY_EPOCH_HANDSHAKE);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);
    ok(num_packets_lost == 0);

    /* PTO fires */
    now = loss.alarm_at;
    ok(quicly_loss_on_alarm(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, &min_packets_to_send,
                            &restrict_sending, on_loss_detected) == 0);
    ok(restrict_sending);
    ok(min_packets_to_send == 2);
    ok(num_packets_lost == 0);

    /* therefore send probes */
    ok(quicly_sentmap_prepare(&loss.sentmap, 3, now, QUICLY_EPOCH_HANDSHAKE) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 4, now, QUICLY_EPOCH_1RTT) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);

    now += 10;

    /* again receives an ack for the Handshake packet, but 1RTT packet remains unacknowledged */
    acked(&loss, 3, QUICLY_EPOCH_HANDSHAKE);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);
    ok(num_packets_lost == 0);

    quicly_loss_dispose(&loss);
}